

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O1

void __thiscall binpac::FlowBuffer::NewFrame(FlowBuffer *this,int frame_length,bool chunked)

{
  NewMessage(this);
  this->mode_ = FRAME_MODE;
  this->frame_length_ = frame_length;
  this->chunked_ = chunked;
  this->have_pending_request_ = true;
  MarkOrCopyFrame(this);
  return;
}

Assistant:

void FlowBuffer::NewFrame(int frame_length, bool chunked)
	{
	FlowBuffer::NewMessage();
	mode_ = FRAME_MODE;
	frame_length_ = frame_length;
	chunked_ = chunked;
	have_pending_request_ = true;
	MarkOrCopyFrame();
	}